

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall
kratos::SystemVerilogCodeGen::SystemVerilogCodeGen
          (SystemVerilogCodeGen *this,Generator *generator,SystemVerilogCodeGenOptions *options)

{
  _Hashtable<kratos::StmtBlock_*,_std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::StmtBlock_*>,_std::hash<kratos::StmtBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  this->_vptr_SystemVerilogCodeGen = (_func_int **)&PTR_dispatch_node_002a57e0;
  this->indent_size = 2;
  this->indent_ = 0;
  (this->empty_indent_str_)._M_dataplus._M_p = (pointer)&(this->empty_indent_str_).field_2;
  (this->empty_indent_str_)._M_string_length = 0;
  (this->empty_indent_str_).field_2._M_local_buf[0] = '\0';
  (this->empty_indent_string_view_)._M_len = 0;
  (this->empty_indent_string_view_)._M_str = (char *)0x0;
  this->generator_ = generator;
  this->skip_indent_ = false;
  (this->label_index_)._M_h._M_buckets = &(this->label_index_)._M_h._M_single_bucket;
  (this->label_index_)._M_h._M_bucket_count = 1;
  (this->label_index_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->label_index_)._M_h._M_element_count = 0;
  (this->label_index_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->label_index_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->label_index_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  SystemVerilogCodeGenOptions::SystemVerilogCodeGenOptions(&this->options_,options);
  Stream::Stream(&this->stream_,generator,this);
  if (((generator->lib_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (generator->lib_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && ((generator->is_external_ & 1U) == 0)) {
    index_named_block_abi_cxx11_
              ((unordered_map<kratos::StmtBlock_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::StmtBlock_*>,_std::equal_to<kratos::StmtBlock_*>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_68,this);
    std::
    _Hashtable<kratos::StmtBlock_*,_std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::StmtBlock_*>,_std::hash<kratos::StmtBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::operator=(&(this->label_index_)._M_h,&local_68);
    std::
    _Hashtable<kratos::StmtBlock_*,_std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::StmtBlock_*>,_std::hash<kratos::StmtBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
    check_yosys_src(this);
  }
  return;
}

Assistant:

SystemVerilogCodeGen::SystemVerilogCodeGen(kratos::Generator* generator,
                                           SystemVerilogCodeGenOptions options)
    : generator_(generator), options_(std::move(options)), stream_(generator, this) {
    // if it's an external file, we don't output anything
    if (generator->external()) return;

    // index the named blocks
    label_index_ = index_named_block();

    // check if we need to inline src attribute with yosys
    check_yosys_src();
}